

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateNonNestedInitializationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  Printer *this_00;
  Descriptor *pDVar1;
  char *pcVar2;
  int __c;
  int i;
  FieldDescriptor *field;
  java *this_01;
  string local_60;
  string local_40;
  int local_1c;
  Printer *pPStack_18;
  int bytecode_estimate;
  Printer *printer_local;
  ImmutableExtensionGenerator *this_local;
  
  local_1c = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  pDVar1 = FieldDescriptor::extension_scope(this->descriptor_);
  this_00 = pPStack_18;
  if (pDVar1 == (Descriptor *)0x0) {
    this_01 = (java *)this->descriptor_;
    UnderscoresToCamelCase_abi_cxx11_(&local_40,this_01,field);
    pcVar2 = FieldDescriptor::index(this->descriptor_,(char *)this_01,__c);
    SimpleItoa_abi_cxx11_(&local_60,(protobuf *)((ulong)pcVar2 & 0xffffffff),i);
    io::Printer::Print(this_00,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                       "name",&local_40,"index",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    local_1c = local_1c + 0x15;
  }
  return local_1c;
}

Assistant:

int ImmutableExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  if (descriptor_->extension_scope() == NULL) {
    // Only applies to non-nested extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
    bytecode_estimate += 21;
  }
  return bytecode_estimate;
}